

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Rune * re2::Regexp::LeadingString(Regexp *re,int *nrune,ParseFlags *flags)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  Regexp **ppRVar4;
  uint *in_RDX;
  int *in_RSI;
  Regexp *in_RDI;
  Regexp *local_10;
  string *local_8;
  
  local_10 = in_RDI;
  while( true ) {
    RVar2 = op(local_10);
    bVar1 = false;
    if (RVar2 == kRegexpConcat) {
      iVar3 = nsub(local_10);
      bVar1 = 0 < iVar3;
    }
    if (!bVar1) break;
    ppRVar4 = sub(local_10);
    local_10 = *ppRVar4;
  }
  *in_RDX = local_10->parse_flags_ & 1;
  RVar2 = op(local_10);
  if (RVar2 == kRegexpLiteral) {
    *in_RSI = 1;
    local_8 = (string *)&local_10->field_7;
  }
  else {
    RVar2 = op(local_10);
    if (RVar2 == kRegexpLiteralString) {
      *in_RSI = (local_10->field_7).field_0.max_;
      local_8 = (local_10->field_7).field_1.name_;
    }
    else {
      *in_RSI = 0;
      local_8 = (string *)0x0;
    }
  }
  return (Rune *)local_8;
}

Assistant:

Rune* Regexp::LeadingString(Regexp* re, int *nrune,
                            Regexp::ParseFlags *flags) {
  while (re->op() == kRegexpConcat && re->nsub() > 0)
    re = re->sub()[0];

  *flags = static_cast<Regexp::ParseFlags>(re->parse_flags_ & Regexp::FoldCase);

  if (re->op() == kRegexpLiteral) {
    *nrune = 1;
    return &re->rune_;
  }

  if (re->op() == kRegexpLiteralString) {
    *nrune = re->nrunes_;
    return re->runes_;
  }

  *nrune = 0;
  return NULL;
}